

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O0

void __thiscall
VectorSUnitTest_count_constructor_Test::TestBody(VectorSUnitTest_count_constructor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  char *in_R9;
  AssertHelper local_6a8;
  Message local_6a0;
  allocator<char> local_691;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  undefined1 local_670 [8];
  AssertionResult gtest_ar_11;
  Message local_658;
  allocator<char> local_649;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  undefined1 local_628 [8];
  AssertionResult gtest_ar_10;
  Message local_610;
  allocator<char> local_601;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar_9;
  Message local_5c8;
  allocator<char> local_5b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  undefined1 local_598 [8];
  AssertionResult gtest_ar_8;
  Message local_580;
  allocator<char> local_571;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  undefined1 local_550 [8];
  AssertionResult gtest_ar_7;
  Message local_538;
  size_type local_530;
  uint local_524;
  undefined1 local_520 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_4f0;
  Message local_4e8;
  bool local_4d9;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar__1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  undefined1 local_4a0 [8];
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
  vsv;
  Message local_348;
  allocator<char> local_339;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_5;
  Message local_300;
  allocator<char> local_2f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_4;
  Message local_2b8;
  allocator<char> local_2a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_3;
  Message local_270;
  allocator<char> local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_2;
  Message local_228;
  allocator<char> local_219;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_1;
  Message local_1e0;
  size_type local_1d8;
  uint local_1cc;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_198;
  Message local_190 [3];
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_;
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL> vs
  ;
  VectorSUnitTest_count_constructor_Test *this_local;
  
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
  vector_s((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
            *)&gtest_ar_.message_,5);
  local_171 = estl::
              vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
              ::empty((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                       *)&gtest_ar_.message_);
  local_171 = !local_171;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_170,&local_171,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_170,(AssertionResult *)"vs.empty()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=(&local_198,local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  local_1cc = 5;
  local_1d8 = estl::
              vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
              ::size((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                      *)&gtest_ar_.message_);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_1c8,"5u","vs.size()",&local_1cc,&local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"",&local_219);
  pvVar3 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                         *)&gtest_ar_.message_,0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1f8,"std::string(\"\")","vs[0]",&local_218,pvVar3);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"",&local_261);
  pvVar3 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                         *)&gtest_ar_.message_,1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_240,"std::string(\"\")","vs[1]",&local_260,pvVar3);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"",&local_2a9);
  pvVar3 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                         *)&gtest_ar_.message_,2);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_288,"std::string(\"\")","vs[2]",&local_2a8,pvVar3);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"",&local_2f1);
  pvVar3 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                         *)&gtest_ar_.message_,3);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_2d0,"std::string(\"\")","vs[3]",&local_2f0,pvVar3);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_300);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"",&local_339);
  pvVar3 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                         *)&gtest_ar_.message_,4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_318,"std::string(\"\")","vs[4]",&local_338,pvVar3);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vsv.data_ptr_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&vsv.data_ptr_,&local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vsv.data_ptr_);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c0,"value",
             (allocator<char> *)
             ((long)&gtest_ar__1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
  vector_s((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
            *)local_4a0,5,&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar__1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_4d9 = estl::
              vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
              ::empty((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                       *)local_4a0);
  local_4d9 = !local_4d9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4d8,&local_4d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar1) {
    testing::Message::Message(&local_4e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_6.message_,(internal *)local_4d8,(AssertionResult *)"vsv.empty()"
               ,"true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4f0,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper(&local_4f0);
    std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  local_524 = 5;
  local_530 = estl::
              vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
              ::size((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                      *)local_4a0);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_520,"5u","vsv.size()",&local_524,&local_530);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
  if (!bVar1) {
    testing::Message::Message(&local_538);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_520);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_538);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"value",&local_571);
  pvVar3 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                         *)local_4a0,0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_550,"std::string(\"value\")","vsv[0]",&local_570,pvVar3);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator(&local_571);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
  if (!bVar1) {
    testing::Message::Message(&local_580);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_550);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_580);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,"value",&local_5b9);
  pvVar3 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                         *)local_4a0,1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_598,"std::string(\"value\")","vsv[1]",&local_5b8,pvVar3);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_598);
  if (!bVar1) {
    testing::Message::Message(&local_5c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_598);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_5c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_5c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,"value",&local_601);
  pvVar3 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                         *)local_4a0,2);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_5e0,"std::string(\"value\")","vsv[2]",&local_600,pvVar3);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator(&local_601);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e0);
  if (!bVar1) {
    testing::Message::Message(&local_610);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x52,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_610);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_610);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"value",&local_649);
  pvVar3 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                         *)local_4a0,3);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_628,"std::string(\"value\")","vsv[3]",&local_648,pvVar3);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator(&local_649);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_628);
  if (!bVar1) {
    testing::Message::Message(&local_658);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_628);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x53,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_658);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_658);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_628);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"value",&local_691);
  pvVar3 = estl::
           vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
           ::operator[]((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                         *)local_4a0,4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_670,"std::string(\"value\")","vsv[4]",&local_690,pvVar3);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar1) {
    testing::Message::Message(&local_6a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_670);
    testing::internal::AssertHelper::AssertHelper
              (&local_6a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6a8,&local_6a0);
    testing::internal::AssertHelper::~AssertHelper(&local_6a8);
    testing::Message::~Message(&local_6a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
  ~vector_s((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
             *)local_4a0);
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
  ~vector_s((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
             *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(VectorSUnitTest, count_constructor)
{
    vector_s<std::string, 10> vs(5);
    EXPECT_FALSE(vs.empty());
    EXPECT_EQ(5u, vs.size());
    EXPECT_EQ(std::string(""), vs[0]);
    EXPECT_EQ(std::string(""), vs[1]);
    EXPECT_EQ(std::string(""), vs[2]);
    EXPECT_EQ(std::string(""), vs[3]);
    EXPECT_EQ(std::string(""), vs[4]);

    vector_s<std::string, 10> vsv(5, "value");
    EXPECT_FALSE(vsv.empty());
    EXPECT_EQ(5u, vsv.size());
    EXPECT_EQ(std::string("value"), vsv[0]);
    EXPECT_EQ(std::string("value"), vsv[1]);
    EXPECT_EQ(std::string("value"), vsv[2]);
    EXPECT_EQ(std::string("value"), vsv[3]);
    EXPECT_EQ(std::string("value"), vsv[4]);
}